

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::NetPrivate::convert_layout(NetPrivate *this,Mat *bottom_blob,Layer *layer,Option *opt)

{
  int *piVar1;
  Mat *pMVar2;
  int iVar3;
  ulong uVar4;
  long in_RCX;
  long in_RDX;
  Mat *in_RSI;
  Mat bottom_blob_packed;
  int elembits;
  int elemcount;
  int dims;
  int dst_elempack;
  Mat bottom_blob_fp32;
  Mat bottom_blob_bf16;
  int local_32c;
  Mat *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  Mat *in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  int local_2f4;
  int local_2bc;
  Mat local_2b0;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  Mat local_258;
  Mat local_200;
  long local_1b8;
  long local_1b0;
  Mat *local_1a8;
  Mat *local_198;
  Mat *local_190;
  Mat *local_180;
  Mat *local_178;
  Mat *local_170;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  Mat *local_158;
  int local_148;
  undefined4 local_144;
  Mat *local_140;
  Mat *local_138;
  int local_128;
  undefined4 local_124;
  Mat *local_120;
  Mat *local_118;
  Mat *local_108;
  Mat *local_f8;
  Mat *local_e8;
  int local_c8;
  undefined4 local_c4;
  Mat *local_c0;
  int local_a8;
  undefined4 local_a4;
  Mat *local_a0;
  int local_88;
  undefined4 local_84;
  Mat *local_80;
  int local_78;
  undefined4 local_74;
  Mat *local_70;
  int local_68;
  undefined4 local_64;
  Mat *local_60;
  int local_58;
  undefined4 local_54;
  Mat *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_20;
  void *local_10;
  
  local_1b8 = in_RCX;
  local_1b0 = in_RDX;
  local_1a8 = in_RSI;
  if ((*(byte *)(in_RCX + 0x20) & 1) != 0) {
    if (in_RSI->elempack == 0) {
      local_2bc = 0;
    }
    else {
      uVar4 = in_RSI->elemsize << 3;
      local_2bc = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                       (long)in_RSI->elempack);
    }
    if ((local_2bc == 0x20) && ((*(byte *)(in_RDX + 0xc) & 1) != 0)) {
      local_180 = &local_200;
      local_200.data = (void *)0x0;
      local_200.refcount = (int *)0x0;
      local_200.elemsize = 0;
      local_200.elempack = 0;
      local_200.allocator = (Allocator *)0x0;
      local_200.dims = 0;
      local_200.w = 0;
      local_200.h = 0;
      local_200.d = 0;
      local_200.c = 0;
      local_200.cstep = 0;
      cast_float32_to_bfloat16
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                 (Option *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      pMVar2 = local_1a8;
      local_118 = local_1a8;
      local_120 = &local_200;
      if (local_1a8 != local_120) {
        if (local_200.refcount != (int *)0x0) {
          local_124 = 1;
          LOCK();
          local_128 = *local_200.refcount;
          *local_200.refcount = *local_200.refcount + 1;
          UNLOCK();
        }
        local_70 = local_1a8;
        if (local_1a8->refcount != (int *)0x0) {
          piVar1 = local_1a8->refcount;
          local_74 = 0xffffffff;
          LOCK();
          local_78 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_78 == 1) {
            if (local_1a8->allocator == (Allocator *)0x0) {
              local_38 = local_1a8->data;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (*local_1a8->allocator->_vptr_Allocator[3])(local_1a8->allocator,local_1a8->data);
            }
          }
        }
        pMVar2->data = (void *)0x0;
        pMVar2->elemsize = 0;
        pMVar2->elempack = 0;
        pMVar2->dims = 0;
        pMVar2->w = 0;
        pMVar2->h = 0;
        pMVar2->d = 0;
        pMVar2->c = 0;
        pMVar2->cstep = 0;
        pMVar2->refcount = (int *)0x0;
        pMVar2->data = local_120->data;
        pMVar2->refcount = local_120->refcount;
        pMVar2->elemsize = local_120->elemsize;
        pMVar2->elempack = local_120->elempack;
        pMVar2->allocator = local_120->allocator;
        pMVar2->dims = local_120->dims;
        pMVar2->w = local_120->w;
        pMVar2->h = local_120->h;
        pMVar2->d = local_120->d;
        pMVar2->c = local_120->c;
        pMVar2->cstep = local_120->cstep;
      }
      local_108 = &local_200;
      local_80 = local_108;
      if (local_200.refcount != (int *)0x0) {
        local_84 = 0xffffffff;
        LOCK();
        local_88 = *local_200.refcount;
        *local_200.refcount = *local_200.refcount + -1;
        UNLOCK();
        if (local_88 == 1) {
          if (local_200.allocator == (Allocator *)0x0) {
            local_30 = local_200.data;
            if (local_200.data != (void *)0x0) {
              free(local_200.data);
            }
          }
          else {
            (*(local_200.allocator)->_vptr_Allocator[3])(local_200.allocator,local_200.data);
          }
        }
      }
      local_200.data = (void *)0x0;
      local_200.elemsize = 0;
      local_200.elempack = 0;
      local_200.dims = 0;
      local_200.w = 0;
      local_200.h = 0;
      local_200.d = 0;
      local_200.c = 0;
      local_200.cstep = 0;
      local_200.refcount = (int *)0x0;
    }
    local_190 = local_1a8;
    if (local_1a8->elempack == 0) {
      local_2f4 = 0;
    }
    else {
      uVar4 = local_1a8->elemsize << 3;
      local_2f4 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                       (long)local_1a8->elempack);
    }
    if ((local_2f4 == 0x10) && ((*(byte *)(local_1b0 + 0xc) & 1) == 0)) {
      local_178 = &local_258;
      local_258.data = (void *)0x0;
      local_258.refcount = (int *)0x0;
      local_258.elemsize = 0;
      local_258.elempack = 0;
      local_258.allocator = (Allocator *)0x0;
      local_258.dims = 0;
      local_258.w = 0;
      local_258.h = 0;
      local_258.d = 0;
      local_258.c = 0;
      local_258.cstep = 0;
      cast_bfloat16_to_float32
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                 (Option *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      pMVar2 = local_1a8;
      local_138 = local_1a8;
      local_140 = &local_258;
      if (local_1a8 != local_140) {
        if (local_258.refcount != (int *)0x0) {
          local_144 = 1;
          LOCK();
          local_148 = *local_258.refcount;
          *local_258.refcount = *local_258.refcount + 1;
          UNLOCK();
        }
        local_60 = local_1a8;
        in_stack_fffffffffffffcf0 = local_1a8;
        if (local_1a8->refcount != (int *)0x0) {
          piVar1 = local_1a8->refcount;
          local_64 = 0xffffffff;
          LOCK();
          local_68 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_68 == 1) {
            if (local_1a8->allocator == (Allocator *)0x0) {
              local_40 = local_1a8->data;
              if (local_40 != (void *)0x0) {
                free(local_40);
              }
            }
            else {
              (*local_1a8->allocator->_vptr_Allocator[3])(local_1a8->allocator,local_1a8->data);
            }
          }
        }
        in_stack_fffffffffffffcf0->data = (void *)0x0;
        in_stack_fffffffffffffcf0->elemsize = 0;
        in_stack_fffffffffffffcf0->elempack = 0;
        in_stack_fffffffffffffcf0->dims = 0;
        in_stack_fffffffffffffcf0->w = 0;
        in_stack_fffffffffffffcf0->h = 0;
        in_stack_fffffffffffffcf0->d = 0;
        in_stack_fffffffffffffcf0->c = 0;
        in_stack_fffffffffffffcf0->cstep = 0;
        in_stack_fffffffffffffcf0->refcount = (int *)0x0;
        pMVar2->data = local_140->data;
        pMVar2->refcount = local_140->refcount;
        pMVar2->elemsize = local_140->elemsize;
        pMVar2->elempack = local_140->elempack;
        pMVar2->allocator = local_140->allocator;
        pMVar2->dims = local_140->dims;
        pMVar2->w = local_140->w;
        pMVar2->h = local_140->h;
        pMVar2->d = local_140->d;
        pMVar2->c = local_140->c;
        pMVar2->cstep = local_140->cstep;
      }
      in_stack_fffffffffffffce8 = &local_258;
      local_f8 = in_stack_fffffffffffffce8;
      local_a0 = in_stack_fffffffffffffce8;
      if (local_258.refcount != (int *)0x0) {
        local_a4 = 0xffffffff;
        LOCK();
        local_a8 = *local_258.refcount;
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (local_a8 == 1) {
          if (local_258.allocator == (Allocator *)0x0) {
            local_20 = local_258.data;
            if (local_258.data != (void *)0x0) {
              free(local_258.data);
            }
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])(local_258.allocator,local_258.data);
          }
        }
      }
      in_stack_fffffffffffffce8->data = (void *)0x0;
      in_stack_fffffffffffffce8->elemsize = 0;
      in_stack_fffffffffffffce8->elempack = 0;
      in_stack_fffffffffffffce8->dims = 0;
      in_stack_fffffffffffffce8->w = 0;
      in_stack_fffffffffffffce8->h = 0;
      in_stack_fffffffffffffce8->d = 0;
      in_stack_fffffffffffffce8->c = 0;
      in_stack_fffffffffffffce8->cstep = 0;
      in_stack_fffffffffffffce8->refcount = (int *)0x0;
    }
  }
  local_25c = 1;
  if ((*(byte *)(local_1b8 + 0x27) & 1) != 0) {
    local_260 = local_1a8->dims;
    local_264 = 0;
    if (local_260 == 1) {
      local_264 = local_1a8->elempack * local_1a8->w;
    }
    if (local_260 == 2) {
      local_264 = local_1a8->elempack * local_1a8->h;
    }
    if ((local_260 == 3) || (local_260 == 4)) {
      local_264 = local_1a8->elempack * local_1a8->c;
    }
    local_198 = local_1a8;
    if (local_1a8->elempack == 0) {
      local_32c = 0;
    }
    else {
      uVar4 = local_1a8->elemsize << 3;
      local_32c = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                       (long)local_1a8->elempack);
    }
    local_268 = local_32c;
    in_stack_fffffffffffffcd8 = local_1a8;
    if ((*(byte *)(local_1b0 + 0xb) & 1) != 0) {
      if (local_32c == 0x20) {
        if ((local_264 % 0x10 == 0) && (iVar3 = cpu_support_x86_avx512(), iVar3 != 0)) {
          local_25c = 0x10;
        }
        else if ((local_264 % 8 == 0) && (iVar3 = cpu_support_x86_avx(), iVar3 != 0)) {
          local_25c = 8;
        }
        else if (local_264 % 4 == 0) {
          local_25c = 4;
        }
      }
      if ((local_268 == 0x10) && (local_264 % 4 == 0)) {
        local_25c = 4;
      }
      if ((local_268 == 8) && (local_264 % 8 == 0)) {
        local_25c = 8;
      }
    }
  }
  if (local_1a8->elempack != local_25c) {
    local_170 = &local_2b0;
    local_2b0.data = (void *)0x0;
    local_2b0.refcount = (int *)0x0;
    local_2b0.elemsize = 0;
    local_2b0.elempack = 0;
    local_2b0.allocator = (Allocator *)0x0;
    local_2b0.dims = 0;
    local_2b0.w = 0;
    local_2b0.h = 0;
    local_2b0.d = 0;
    local_2b0.c = 0;
    local_2b0.cstep = 0;
    convert_packing(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                    (Option *)in_stack_fffffffffffffcd8);
    local_158 = local_1a8;
    local_160 = &local_2b0;
    if (local_1a8 != local_160) {
      if (local_2b0.refcount != (int *)0x0) {
        local_164 = 1;
        LOCK();
        local_168 = *local_2b0.refcount;
        *local_2b0.refcount = *local_2b0.refcount + 1;
        UNLOCK();
      }
      local_50 = local_1a8;
      if (local_1a8->refcount != (int *)0x0) {
        piVar1 = local_1a8->refcount;
        local_54 = 0xffffffff;
        LOCK();
        local_58 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_58 == 1) {
          if (local_1a8->allocator == (Allocator *)0x0) {
            local_48 = local_1a8->data;
            if (local_48 != (void *)0x0) {
              free(local_48);
            }
          }
          else {
            (*local_1a8->allocator->_vptr_Allocator[3])(local_1a8->allocator,local_1a8->data);
          }
        }
      }
      local_1a8->data = (void *)0x0;
      local_1a8->elemsize = 0;
      local_1a8->elempack = 0;
      local_1a8->dims = 0;
      local_1a8->w = 0;
      local_1a8->h = 0;
      local_1a8->d = 0;
      local_1a8->c = 0;
      local_1a8->cstep = 0;
      local_1a8->refcount = (int *)0x0;
      local_1a8->data = local_160->data;
      local_1a8->refcount = local_160->refcount;
      local_1a8->elemsize = local_160->elemsize;
      local_1a8->elempack = local_160->elempack;
      local_1a8->allocator = local_160->allocator;
      local_1a8->dims = local_160->dims;
      local_1a8->w = local_160->w;
      local_1a8->h = local_160->h;
      local_1a8->d = local_160->d;
      local_1a8->c = local_160->c;
      local_1a8->cstep = local_160->cstep;
    }
    local_e8 = &local_2b0;
    if (local_2b0.refcount != (int *)0x0) {
      local_c4 = 0xffffffff;
      LOCK();
      local_c8 = *local_2b0.refcount;
      *local_2b0.refcount = *local_2b0.refcount + -1;
      UNLOCK();
      if (local_c8 == 1) {
        local_c0 = local_e8;
        if (local_2b0.allocator == (Allocator *)0x0) {
          local_10 = local_2b0.data;
          if (local_2b0.data != (void *)0x0) {
            free(local_2b0.data);
          }
        }
        else {
          (*(local_2b0.allocator)->_vptr_Allocator[3])(local_2b0.allocator,local_2b0.data);
        }
      }
    }
  }
  return 0;
}

Assistant:

int NetPrivate::convert_layout(Mat& bottom_blob, const Layer* layer, const Option& opt) const
{
    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (opt.use_fp16_storage && cpu_support_arm_asimdhp())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_RVV
    if (opt.use_fp16_storage && cpu_support_riscv_v() && cpu_support_riscv_zfh())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_RVV
#if NCNN_BF16
    if (opt.use_bf16_storage)
    {
        if (bottom_blob.elembits() == 32 && layer->support_bf16_storage)
        {
            Mat bottom_blob_bf16;
            cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
            bottom_blob = bottom_blob_bf16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_bf16_storage)
        {
            Mat bottom_blob_fp32;
            cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_BF16
    {
        // no type conversion
    }
    // *INDENT-ON*
    // clang-format on

    int dst_elempack = 1;
    if (opt.use_packing_layout)
    {
        // resolve dst_elempack
        int dims = bottom_blob.dims;
        int elemcount = 0;
        if (dims == 1) elemcount = bottom_blob.elempack * bottom_blob.w;
        if (dims == 2) elemcount = bottom_blob.elempack * bottom_blob.h;
        if (dims == 3 || dims == 4) elemcount = bottom_blob.elempack * bottom_blob.c;

        int elembits = bottom_blob.elembits();

        if (layer->support_packing)
        {
            if (elembits == 32)
            {
#if NCNN_AVX512
                if (elemcount % 16 == 0 && ncnn::cpu_support_x86_avx512())
                    dst_elempack = 16;
                else if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_AVX
                if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 4;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 16)
            {
#if NCNN_ARM82
                if (elemcount % 8 == 0 && ncnn::cpu_support_arm_asimdhp() && opt.use_fp16_arithmetic)
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 2;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 8)
            {
#if NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 1;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 8 == 0)
                    dst_elempack = 8;
#endif
            }
        }
    }

    if (bottom_blob.elempack != dst_elempack)
    {
        Mat bottom_blob_packed;
        convert_packing(bottom_blob, bottom_blob_packed, dst_elempack, opt);
        bottom_blob = bottom_blob_packed;
    }

    return 0;
}